

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

string * __thiscall
JSON::JSONArray::toString_abi_cxx11_(string *__return_storage_ptr__,JSONArray *this,int indent)

{
  int iVar1;
  stringstream ss;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  iVar1 = 0;
  if (0 < indent) {
    iVar1 = indent;
  }
  while (iVar1 != 0) {
    std::operator<<(local_1a8," ");
    iVar1 = iVar1 + -1;
  }
  operator<<(local_1a8,this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  return __return_storage_ptr__;
}

Assistant:

string JSONArray::toString(int indent) const {
	stringstream ss;
	for(int i=0;i<indent;i++)
		ss << " ";
	ss << (*this);
	return ss.str();
}